

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O1

string * __thiscall
t_d_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  _func_int *p_Var2;
  long lVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  uint uVar6;
  t_const_value_type tVar7;
  t_type *ptVar8;
  ostream *poVar9;
  t_type *ptVar10;
  int64_t iVar11;
  ostringstream *this_00;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var;
  long *plVar15;
  undefined4 extraout_var_00;
  size_type *psVar16;
  ulong uVar17;
  char *pcVar18;
  pointer pptVar19;
  t_type *type_00;
  _func_int **pp_Var20;
  bool bVar21;
  undefined1 auVar22 [12];
  string val;
  string val_1;
  ostringstream out;
  string local_220;
  string local_200;
  t_type *local_1e0;
  string local_1d8;
  string *local_1b8;
  t_d_generator *local_1b0;
  undefined1 local_1a8 [376];
  
  ptVar8 = t_type::get_true_type(type);
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[10])(ptVar8);
    if ((char)iVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      render_type_name_abi_cxx11_(&local_220,this,ptVar8,false);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," v;",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xb])(ptVar8);
      local_1b8 = __return_storage_ptr__;
      if (((char)iVar5 == '\0') &&
         (iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8), (char)iVar5 == '\0')) {
        iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[0x10])(ptVar8);
        if ((char)iVar5 == '\0') {
          iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xe])(ptVar8);
          if ((char)iVar5 == '\0') {
            iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xf])(ptVar8);
            if ((char)iVar5 == '\0') {
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])(ptVar8);
              std::operator+(pbVar14,"Compiler error: Invalid type in render_const_value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar5));
              __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            pptVar19 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar19 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar8 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
              do {
                render_const_value_abi_cxx11_(&local_220,this,ptVar8,*pptVar19);
                poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"v ~= ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                pptVar19 = pptVar19 + 1;
              } while (pptVar19 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
          else {
            pptVar19 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            if (pptVar19 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              ptVar8 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
              do {
                render_const_value_abi_cxx11_(&local_220,this,ptVar8,*pptVar19);
                poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"v ~= ",5);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                pptVar19 = pptVar19 + 1;
              } while (pptVar19 !=
                       (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_finish);
            }
          }
        }
        else {
          p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var12 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var13 != p_Var12) {
            ptVar10 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
            local_1e0 = *(t_type **)&ptVar8[1].annotations_._M_t._M_impl;
            do {
              render_const_value_abi_cxx11_
                        (&local_220,this,ptVar10,*(t_const_value **)(p_Var13 + 1));
              render_const_value_abi_cxx11_
                        (&local_200,this,local_1e0,(t_const_value *)p_Var13[1]._M_parent);
              poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"v[",2);
              ptVar8 = t_type::get_true_type(ptVar10);
              iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
              if (((char)iVar5 == '\0') &&
                 (iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[10])(ptVar8), (char)iVar5 == '\0')) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"cast(immutable(",0xf);
                render_type_name_abi_cxx11_(&local_1d8,this,ptVar10,false);
                poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,
                                    local_1d8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"))",2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p);
                }
              }
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                                  local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] = ",4);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_200._M_dataplus._M_p,local_200._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_200._M_dataplus._M_p != &local_200.field_2) {
                operator_delete(local_200._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
            } while ((_Rb_tree_header *)p_Var13 != p_Var12);
          }
        }
      }
      else {
        poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"v = ",4);
        uVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8);
        pcVar18 = "";
        if ((char)uVar6 != '\0') {
          pcVar18 = "new ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,pcVar18,(ulong)((uVar6 & 0xff) << 2));
        render_type_name_abi_cxx11_(&local_220,this,ptVar8,false);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        ptVar10 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1e0 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if (ptVar10 != local_1e0) {
          local_1b0 = this;
          do {
            pp_Var20 = ptVar8[1].super_t_doc._vptr_t_doc;
            if (pp_Var20 == (_func_int **)ptVar8[1].super_t_doc.doc_._M_dataplus._M_p) {
              type_00 = (t_type *)0x0;
            }
            else {
              type_00 = (t_type *)0x0;
              do {
                p_Var2 = *pp_Var20;
                lVar3 = *(long *)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8);
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                lVar4 = *(long *)(lVar3 + 0x48);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,lVar4,*(long *)(lVar3 + 0x50) + lVar4);
                __n = *(size_t *)(p_Var2 + 0x70);
                if (__n == local_220._M_string_length) {
                  if (__n == 0) {
                    bVar21 = true;
                  }
                  else {
                    iVar5 = bcmp(*(void **)(p_Var2 + 0x68),local_220._M_dataplus._M_p,__n);
                    bVar21 = iVar5 == 0;
                  }
                }
                else {
                  bVar21 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                if (bVar21) {
                  type_00 = *(t_type **)(*pp_Var20 + 0x60);
                }
                pp_Var20 = pp_Var20 + 1;
              } while (pp_Var20 != (_func_int **)ptVar8[1].super_t_doc.doc_._M_dataplus._M_p);
            }
            this = local_1b0;
            if (type_00 == (t_type *)0x0) {
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar5 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])(ptVar8);
              std::operator+(&local_200,"Type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar5));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_200);
              local_220._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar16) {
                local_220.field_2._M_allocated_capacity = *psVar16;
                local_220.field_2._8_4_ = (undefined4)plVar15[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar16;
              }
              local_220._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              lVar3 = *(long *)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8);
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              lVar4 = *(long *)(lVar3 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,lVar4,*(long *)(lVar3 + 0x50) + lVar4);
              std::operator+(pbVar14,&local_220,&local_1d8);
              __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            render_const_value_abi_cxx11_
                      (&local_220,local_1b0,type_00,
                       *(t_const_value **)&(ptVar10->super_t_doc).has_doc_);
            poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"v.set!`",7);
            lVar3 = *(long *)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8);
            lVar4 = *(long *)(lVar3 + 0x48);
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_200,lVar4,*(long *)(lVar3 + 0x50) + lVar4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_200._M_dataplus._M_p,local_200._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`(",2);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            ptVar10 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar10);
          } while (ptVar10 != local_1e0);
        }
      }
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      __return_storage_ptr__ = local_1b8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return v;",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar9 = t_generator::indent((t_generator *)this,(ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}()",3);
      goto LAB_001af95b;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cast(",5);
    render_type_name_abi_cxx11_(&local_220,this,ptVar8,false);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar9);
    goto LAB_001af8ad;
  }
  uVar6 = *(uint *)&ptVar8[1].super_t_doc._vptr_t_doc;
  switch(uVar6) {
  case 1:
    local_220._M_dataplus._M_p._0_1_ = 0x22;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_220,1);
    t_generator::get_escaped_string_abi_cxx11_(&local_220,(t_generator *)this,value);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
    local_200._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_200,1);
    break;
  case 2:
    iVar11 = t_const_value::get_integer(value);
    pcVar18 = "false";
    if (0 < iVar11) {
      pcVar18 = "true";
    }
    uVar17 = (ulong)(0 < iVar11) ^ 5;
    goto LAB_001af918;
  case 3:
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"cast(",5);
    render_type_name_abi_cxx11_(&local_220,this,ptVar8,false);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar9);
    break;
  case 5:
    goto switchD_001af3a0_caseD_5;
  case 6:
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
    uVar17 = 1;
    pcVar18 = "L";
LAB_001af918:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar18,uVar17);
    goto LAB_001af95b;
  case 7:
    tVar7 = t_const_value::get_type(value);
    if (tVar7 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_001af95b;
    }
    goto switchD_001af3a0_caseD_5;
  default:
    auVar22 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar6,auVar22._8_4_);
    std::operator+(auVar22._0_8_,"Compiler error: No const of base type ",&local_220);
    __cxa_throw(auVar22._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
LAB_001af8ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
LAB_001af95b:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
switchD_001af3a0_caseD_5:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)local_1a8);
  goto LAB_001af95b;
}

Assistant:

string render_const_value(t_type* type, t_const_value* value) {
    // Resolve any typedefs.
    type = get_true_type(type);

    ostringstream out;
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_STRING:
        out << '"' << get_escaped_string(value) << '"';
        break;
      case t_base_type::TYPE_BOOL:
        out << ((value->get_integer() > 0) ? "true" : "false");
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
        out << "cast(" << render_type_name(type) << ")" << value->get_integer();
        break;
      case t_base_type::TYPE_I32:
        out << value->get_integer();
        break;
      case t_base_type::TYPE_I64:
        out << value->get_integer() << "L";
        break;
      case t_base_type::TYPE_DOUBLE:
        if (value->get_type() == t_const_value::CV_INTEGER) {
          out << value->get_integer();
        } else {
          out << value->get_double();
        }
        break;
      default:
        throw "Compiler error: No const of base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "cast(" << render_type_name(type) << ")" << value->get_integer();
    } else {
      out << "{" << endl;
      indent_up();

      indent(out) << render_type_name(type) << " v;" << endl;
      if (type->is_struct() || type->is_xception()) {
        indent(out) << "v = " << (type->is_xception() ? "new " : "") << render_type_name(type)
                    << "();" << endl;

        const vector<t_field*>& fields = ((t_struct*)type)->get_members();
        vector<t_field*>::const_iterator f_iter;
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          t_type* field_type = nullptr;
          for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
            if ((*f_iter)->get_name() == v_iter->first->get_string()) {
              field_type = (*f_iter)->get_type();
            }
          }
          if (field_type == nullptr) {
            throw "Type error: " + type->get_name() + " has no field "
                + v_iter->first->get_string();
          }
          string val = render_const_value(field_type, v_iter->second);
          indent(out) << "v.set!`" << v_iter->first->get_string() << "`(" << val << ");" << endl;
        }
      } else if (type->is_map()) {
        t_type* ktype = ((t_map*)type)->get_key_type();
        t_type* vtype = ((t_map*)type)->get_val_type();
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string key = render_const_value(ktype, v_iter->first);
          string val = render_const_value(vtype, v_iter->second);
          indent(out) << "v[";
          if (!is_immutable_type(ktype)) {
            out << "cast(immutable(" << render_type_name(ktype) << "))";
          }
          out << key << "] = " << val << ";" << endl;
        }
      } else if (type->is_list()) {
        t_type* etype = ((t_list*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else if (type->is_set()) {
        t_type* etype = ((t_set*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else {
        throw "Compiler error: Invalid type in render_const_value: " + type->get_name();
      }
      indent(out) << "return v;" << endl;

      indent_down();
      indent(out) << "}()";
    }

    return out.str();
  }